

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O0

clock_updates_list_t * __thiscall
tchecker::clock_updates_visitor_t::clock_updates_of_all_clock_instances
          (clock_updates_list_t *__return_storage_ptr__,clock_updates_visitor_t *this,
          typed_lvalue_expression_t *x)

{
  bool bVar1;
  uint *puVar2;
  clock_updates_list_t *pcVar3;
  clock_id_t local_2c;
  range_t<unsigned_int,_unsigned_int> rStack_28;
  clock_id_t z;
  range_t<unsigned_int,_unsigned_int> x_instances;
  typed_lvalue_expression_t *x_local;
  clock_updates_visitor_t *this_local;
  clock_updates_list_t *l;
  
  x_instances = (range_t<unsigned_int,_unsigned_int>)x;
  rStack_28 = extract_lvalue_variable_ids(x);
  bVar1 = range_t<unsigned_int,_unsigned_int>::empty(&stack0xffffffffffffffd8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    puVar2 = range_t<unsigned_int,_unsigned_int>::begin(&stack0xffffffffffffffd8);
    local_2c = *puVar2;
    pcVar3 = clock_updates_map_t::operator[](&this->_u,local_2c);
    clock_updates_list_t::clock_updates_list_t(__return_storage_ptr__,pcVar3);
    while( true ) {
      local_2c = local_2c + 1;
      puVar2 = range_t<unsigned_int,_unsigned_int>::end(&stack0xffffffffffffffd8);
      if (local_2c == *puVar2) break;
      pcVar3 = clock_updates_map_t::operator[](&this->_u,local_2c);
      clock_updates_list_t::absorbing_merge(__return_storage_ptr__,pcVar3);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("!x_instances.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/statement/static_analysis.cc"
                ,0x2af,
                "tchecker::clock_updates_list_t tchecker::clock_updates_visitor_t::clock_updates_of_all_clock_instances(const tchecker::typed_lvalue_expression_t &) const"
               );
}

Assistant:

tchecker::clock_updates_list_t clock_updates_of_all_clock_instances(tchecker::typed_lvalue_expression_t const & x) const
  {
    tchecker::range_t<tchecker::variable_id_t> x_instances = tchecker::extract_lvalue_variable_ids(x);
    assert(!x_instances.empty());

    tchecker::clock_id_t z = x_instances.begin();
    tchecker::clock_updates_list_t l = _u[z];
    for (++z; z != x_instances.end(); ++z)
      l.absorbing_merge(_u[z]);

    return l;
  }